

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O1

char * cpio_rename(char *name)

{
  byte bVar1;
  FILE *__stream;
  byte *pbVar2;
  byte *pbVar3;
  
  __stream = fopen("/dev/tty","r+");
  if (__stream == (FILE *)0x0) {
    return name;
  }
  fprintf(__stream,"%s (Enter/./(new name))? ",name);
  fflush(__stream);
  pbVar2 = (byte *)fgets(cpio_rename::buff,0x400,__stream);
  fclose(__stream);
  if (pbVar2 == (byte *)0x0) {
    return (char *)0x0;
  }
  do {
    bVar1 = *pbVar2;
    pbVar3 = pbVar2;
    if (bVar1 < 10) {
      if (bVar1 != 9) {
        if (bVar1 == 0) {
          return (char *)0x0;
        }
        goto LAB_0010b78d;
      }
    }
    else if (bVar1 != 0x20) {
      if (bVar1 == 10) {
        return (char *)0x0;
      }
      if ((bVar1 == 0x2e) && (pbVar2[1] == 10)) {
        return name;
      }
LAB_0010b78d:
      for (; (*pbVar3 != 0 && (*pbVar3 != 10)); pbVar3 = pbVar3 + 1) {
      }
      *pbVar3 = 0;
      return (char *)pbVar2;
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

static const char *
cpio_rename(const char *name)
{
	static char buff[1024];
	FILE *t;
	char *p, *ret;
#if defined(_WIN32) && !defined(__CYGWIN__)
	FILE *to;

	t = fopen("CONIN$", "r");
	if (t == NULL)
		return (name);
	to = fopen("CONOUT$", "w");
	if (to == NULL) {
		fclose(t);
		return (name);
	}
	fprintf(to, "%s (Enter/./(new name))? ", name);
	fclose(to);
#else
	t = fopen("/dev/tty", "r+");
	if (t == NULL)
		return (name);
	fprintf(t, "%s (Enter/./(new name))? ", name);
	fflush(t);
#endif

	p = fgets(buff, sizeof(buff), t);
	fclose(t);
	if (p == NULL)
		/* End-of-file is a blank line. */
		return (NULL);

	while (*p == ' ' || *p == '\t')
		++p;
	if (*p == '\n' || *p == '\0')
		/* Empty line. */
		return (NULL);
	if (*p == '.' && p[1] == '\n')
		/* Single period preserves original name. */
		return (name);
	ret = p;
	/* Trim the final newline. */
	while (*p != '\0' && *p != '\n')
		++p;
	/* Overwrite the final \n with a null character. */
	*p = '\0';
	return (ret);
}